

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[35],char_const*,char[36],char_const*,char[20],std::__cxx11::string,char[17]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [35],char **Args_1,
          char (*Args_2) [36],char **Args_3,char (*Args_4) [20],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_5,
          char (*Args_6) [17])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [20];
  char **Args_local_3;
  char (*Args_local_2) [36];
  char **Args_local_1;
  char (*Args_local) [35];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[35],char_const*,char[36],char_const*,char[20],std::__cxx11::string,char[17]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [35])this,(char **)Args,(char (*) [36])Args_1,(char **)Args_2,
             (char (*) [20])Args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_4,
             (char (*) [17])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}